

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

string_t duckdb::VectorStringCastOperator<duckdb::NumericTryCastToBit>::
         Operation<duckdb::uhugeint_t,duckdb::string_t>
                   (uhugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  uhugeint_t input_00;
  anon_union_16_2_67f50693_for_value aVar1;
  Vector *in_stack_00000010;
  Vector *result;
  
  input_00.upper = (uint64_t)dataptr;
  input_00.lower = (uint64_t)result;
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       NumericTryCastToBit::Operation<duckdb::uhugeint_t>(input_00,in_stack_00000010);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}